

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O0

void __thiscall
embree::ParseStream::ParseStream
          (ParseStream *this,Ref<embree::Stream<int>_> *cin,string *seps,string *endl,bool multiLine
          )

{
  byte multiLine_00;
  Ref<embree::Stream<int>_> *pRVar1;
  Stream<int> *pSVar2;
  string *in_RCX;
  string *in_RDX;
  Ref<embree::Stream<int>_> *in_RSI;
  StringStream *in_RDI;
  byte in_R8B;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc0;
  StringStream *this_00;
  
  multiLine_00 = in_R8B & 1;
  this_00 = in_RDI;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Stream
            (in_stack_ffffffffffffffc0);
  (in_RDI->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount._vptr_RefCount = (_func_int **)&PTR__ParseStream_005fe210;
  pRVar1 = &in_RDI->cin;
  pSVar2 = (Stream<int> *)::operator_new(0x270);
  StringStream::StringStream(this_00,in_RSI,in_RDX,in_RCX,(bool)multiLine_00);
  pRVar1->ptr = pSVar2;
  if (pRVar1->ptr != (Stream<int> *)0x0) {
    (*(pRVar1->ptr->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

ParseStream (const Ref<Stream<int> >& cin, const std::string& seps = "\n\t\r ",
                 const std::string& endl = "", bool multiLine = false)
      : cin(new StringStream(cin,seps,endl,multiLine)) {}